

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mixed_union.c
# Opt level: O1

_Bool array_array_container_inplace_union
                (array_container_t *src_1,array_container_t *src_2,container_t **dst)

{
  int iVar1;
  int iVar2;
  int32_t min;
  array_container_t *out;
  bitset_container_t *bitset;
  uint64_t uVar3;
  size_t sVar4;
  _Bool _Var5;
  int iVar6;
  bitset_container_t *ourbitset;
  
  iVar1 = src_1->cardinality;
  iVar2 = src_2->cardinality;
  iVar6 = iVar2 + iVar1;
  *dst = (container_t *)0x0;
  if (iVar6 < 0x1001) {
    if (src_1->capacity < iVar6) {
      out = array_container_create_given_capacity(iVar6 * 2);
      *dst = out;
      if (out == (array_container_t *)0x0) goto LAB_0011b8fc;
      array_container_union(src_1,src_2,out);
    }
    else {
      memmove(src_1->array + iVar2,src_1->array,(long)iVar1 * 2);
      sVar4 = union_uint16(src_1->array + src_2->cardinality,(long)src_1->cardinality,src_2->array,
                           (long)src_2->cardinality,src_1->array);
      src_1->cardinality = (int32_t)sVar4;
    }
    _Var5 = false;
  }
  else {
    bitset = bitset_container_create();
    *dst = bitset;
    if (bitset != (bitset_container_t *)0x0) {
      bitset_set_list(bitset->words,src_1->array,(long)src_1->cardinality);
      uVar3 = bitset_set_list_withcard
                        (bitset->words,(long)src_1->cardinality,src_2->array,
                         (long)src_2->cardinality);
      min = (int32_t)uVar3;
      bitset->cardinality = min;
      if (0x1000 < min) {
        return 0x1000 < min;
      }
      if (src_1->capacity < min) {
        array_container_grow(src_1,min,false);
      }
      bitset_extract_setbits_uint16(bitset->words,0x400,src_1->array,0);
      src_1->cardinality = bitset->cardinality;
      *dst = src_1;
      bitset_container_free(bitset);
      return false;
    }
LAB_0011b8fc:
    _Var5 = true;
  }
  return _Var5;
}

Assistant:

bool array_array_container_inplace_union(array_container_t *src_1,
                                         const array_container_t *src_2,
                                         container_t **dst) {
    int totalCardinality = src_1->cardinality + src_2->cardinality;
    *dst = NULL;
    if (totalCardinality <= DEFAULT_MAX_SIZE) {
        if (src_1->capacity < totalCardinality) {
            *dst = array_container_create_given_capacity(
                2 * totalCardinality);  // be purposefully generous
            if (*dst != NULL) {
                array_container_union(src_1, src_2, CAST_array(*dst));
            } else {
                return true;  // otherwise failure won't be caught
            }
            return false;  // not a bitset
        } else {
            memmove(src_1->array + src_2->cardinality, src_1->array,
                    src_1->cardinality * sizeof(uint16_t));
            // In theory, we could use fast_union_uint16, but it is unsafe. It
            // fails with Intel compilers in particular.
            // https://github.com/RoaringBitmap/CRoaring/pull/452
            // See report https://github.com/RoaringBitmap/CRoaring/issues/476
            src_1->cardinality = (int32_t)union_uint16(
                src_1->array + src_2->cardinality, src_1->cardinality,
                src_2->array, src_2->cardinality, src_1->array);
            return false;  // not a bitset
        }
    }
    *dst = bitset_container_create();
    bool returnval = true;  // expect a bitset
    if (*dst != NULL) {
        bitset_container_t *ourbitset = CAST_bitset(*dst);
        bitset_set_list(ourbitset->words, src_1->array, src_1->cardinality);
        ourbitset->cardinality = (int32_t)bitset_set_list_withcard(
            ourbitset->words, src_1->cardinality, src_2->array,
            src_2->cardinality);
        if (ourbitset->cardinality <= DEFAULT_MAX_SIZE) {
            // need to convert!
            if (src_1->capacity < ourbitset->cardinality) {
                array_container_grow(src_1, ourbitset->cardinality, false);
            }

            bitset_extract_setbits_uint16(ourbitset->words,
                                          BITSET_CONTAINER_SIZE_IN_WORDS,
                                          src_1->array, 0);
            src_1->cardinality = ourbitset->cardinality;
            *dst = src_1;
            bitset_container_free(ourbitset);
            returnval = false;  // not going to be a bitset
        }
    }
    return returnval;
}